

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

void ma_device__on_data(ma_device *pDevice,void *pFramesOut,void *pFramesIn,ma_uint32 frameCount)

{
  ma_device_state mVar1;
  uint uVar2;
  void *pvVar3;
  void *pvVar4;
  uint local_30;
  ma_uint32 framesToProcessThisIteration;
  ma_uint32 totalFramesRemaining;
  ma_uint32 totalFramesProcessed;
  ma_uint32 frameCount_local;
  void *pFramesIn_local;
  void *pFramesOut_local;
  ma_device *pDevice_local;
  
  if (pDevice == (ma_device *)0x0) {
    __assert_fail("pDevice != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                  ,0x1a86,"void ma_device__on_data(ma_device *, void *, const void *, ma_uint32)");
  }
  mVar1 = ma_device_get_state(pDevice);
  if (mVar1 != ma_device_state_stopping) {
    if (pDevice->noFixedSizedCallback == '\0') {
      for (framesToProcessThisIteration = 0; framesToProcessThisIteration < frameCount;
          framesToProcessThisIteration = local_30 + framesToProcessThisIteration) {
        uVar2 = frameCount - framesToProcessThisIteration;
        local_30 = 0;
        if (pFramesIn != (void *)0x0) {
          if ((pDevice->capture).intermediaryBufferLen < (pDevice->capture).intermediaryBufferCap) {
            local_30 = uVar2;
            if ((pDevice->capture).intermediaryBufferCap - (pDevice->capture).intermediaryBufferLen
                < uVar2) {
              local_30 = (pDevice->capture).intermediaryBufferCap -
                         (pDevice->capture).intermediaryBufferLen;
            }
            pvVar3 = ma_offset_pcm_frames_ptr
                               ((pDevice->capture).pIntermediaryBuffer,
                                (ulong)(pDevice->capture).intermediaryBufferLen,
                                (pDevice->capture).format,(pDevice->capture).channels);
            pvVar4 = ma_offset_pcm_frames_const_ptr
                               (pFramesIn,(ulong)framesToProcessThisIteration,
                                (pDevice->capture).format,(pDevice->capture).channels);
            ma_copy_pcm_frames(pvVar3,pvVar4,(ulong)local_30,(pDevice->capture).format,
                               (pDevice->capture).channels);
            (pDevice->capture).intermediaryBufferLen =
                 local_30 + (pDevice->capture).intermediaryBufferLen;
          }
          if (((pDevice->capture).intermediaryBufferLen == (pDevice->capture).intermediaryBufferCap)
             && (pDevice->type != ma_device_type_duplex)) {
            ma_device__on_data_inner
                      (pDevice,(void *)0x0,(pDevice->capture).pIntermediaryBuffer,
                       (pDevice->capture).intermediaryBufferCap);
            (pDevice->capture).intermediaryBufferLen = 0;
          }
        }
        if (pFramesOut != (void *)0x0) {
          if ((pDevice->playback).intermediaryBufferLen != 0) {
            if ((pDevice->type != ma_device_type_duplex) &&
               (local_30 = uVar2, (pDevice->playback).intermediaryBufferLen < uVar2)) {
              local_30 = (pDevice->playback).intermediaryBufferLen;
            }
            pvVar3 = ma_offset_pcm_frames_ptr
                               (pFramesOut,(ulong)framesToProcessThisIteration,
                                (pDevice->playback).format,(pDevice->playback).channels);
            pvVar4 = ma_offset_pcm_frames_ptr
                               ((pDevice->playback).pIntermediaryBuffer,
                                (ulong)((pDevice->playback).intermediaryBufferCap -
                                       (pDevice->playback).intermediaryBufferLen),
                                (pDevice->playback).format,(pDevice->playback).channels);
            ma_copy_pcm_frames(pvVar3,pvVar4,(ulong)local_30,(pDevice->playback).format,
                               (pDevice->playback).channels);
            (pDevice->playback).intermediaryBufferLen =
                 (pDevice->playback).intermediaryBufferLen - local_30;
          }
          if (((pDevice->playback).intermediaryBufferLen == 0) &&
             (pDevice->type != ma_device_type_duplex)) {
            ma_device__on_data_inner
                      (pDevice,(pDevice->playback).pIntermediaryBuffer,(void *)0x0,
                       (pDevice->playback).intermediaryBufferCap);
            (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          }
        }
        if ((pDevice->type == ma_device_type_duplex) &&
           ((pDevice->capture).intermediaryBufferLen == (pDevice->capture).intermediaryBufferCap)) {
          ma_device__on_data_inner
                    (pDevice,(pDevice->playback).pIntermediaryBuffer,
                     (pDevice->capture).pIntermediaryBuffer,(pDevice->capture).intermediaryBufferCap
                    );
          (pDevice->playback).intermediaryBufferLen = (pDevice->playback).intermediaryBufferCap;
          (pDevice->capture).intermediaryBufferLen = 0;
        }
      }
    }
    else {
      ma_device__on_data_inner(pDevice,pFramesOut,pFramesIn,frameCount);
    }
  }
  return;
}

Assistant:

static void ma_device__on_data(ma_device* pDevice, void* pFramesOut, const void* pFramesIn, ma_uint32 frameCount)
{
    MA_ASSERT(pDevice != NULL);

    /* Don't read more data from the client if we're in the process of stopping. */
    if (ma_device_get_state(pDevice) == ma_device_state_stopping) {
        return;
    }

    if (pDevice->noFixedSizedCallback) {
        /* Fast path. Not using a fixed sized callback. Process directly from the specified buffers. */
        ma_device__on_data_inner(pDevice, pFramesOut, pFramesIn, frameCount);
    } else {
        /* Slow path. Using a fixed sized callback. Need to use the intermediary buffer. */
        ma_uint32 totalFramesProcessed = 0;

        while (totalFramesProcessed < frameCount) {
            ma_uint32 totalFramesRemaining = frameCount - totalFramesProcessed;
            ma_uint32 framesToProcessThisIteration = 0;

            if (pFramesIn != NULL) {
                /* Capturing. Write to the intermediary buffer. If there's no room, fire the callback to empty it. */
                if (pDevice->capture.intermediaryBufferLen < pDevice->capture.intermediaryBufferCap) {
                    /* There's some room left in the intermediary buffer. Write to it without firing the callback. */
                    framesToProcessThisIteration = totalFramesRemaining;
                    if (framesToProcessThisIteration > pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen) {
                        framesToProcessThisIteration = pDevice->capture.intermediaryBufferCap - pDevice->capture.intermediaryBufferLen;
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferLen, pDevice->capture.format, pDevice->capture.channels),
                        ma_offset_pcm_frames_const_ptr(pFramesIn, totalFramesProcessed, pDevice->capture.format, pDevice->capture.channels),
                        framesToProcessThisIteration,
                        pDevice->capture.format, pDevice->capture.channels);

                    pDevice->capture.intermediaryBufferLen += framesToProcessThisIteration;
                }

                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    /* No room left in the intermediary buffer. Fire the data callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* We'll do the duplex data callback later after we've processed the playback data. */
                    } else {
                        ma_device__on_data_inner(pDevice, NULL, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                        /* The intermediary buffer has just been drained. */
                        pDevice->capture.intermediaryBufferLen = 0;
                    }
                }
            }

            if (pFramesOut != NULL) {
                /* Playing back. Read from the intermediary buffer. If there's nothing in it, fire the callback to fill it. */
                if (pDevice->playback.intermediaryBufferLen > 0) {
                    /* There's some content in the intermediary buffer. Read from that without firing the callback. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* The frames processed this iteration for a duplex device will always be based on the capture side. Leave it unmodified. */
                    } else {
                        framesToProcessThisIteration = totalFramesRemaining;
                        if (framesToProcessThisIteration > pDevice->playback.intermediaryBufferLen) {
                            framesToProcessThisIteration = pDevice->playback.intermediaryBufferLen;
                        }
                    }

                    ma_copy_pcm_frames(
                        ma_offset_pcm_frames_ptr(pFramesOut, totalFramesProcessed, pDevice->playback.format, pDevice->playback.channels),
                        ma_offset_pcm_frames_ptr(pDevice->playback.pIntermediaryBuffer, pDevice->playback.intermediaryBufferCap - pDevice->playback.intermediaryBufferLen, pDevice->playback.format, pDevice->playback.channels),
                        framesToProcessThisIteration,
                        pDevice->playback.format, pDevice->playback.channels);

                    pDevice->playback.intermediaryBufferLen -= framesToProcessThisIteration;
                }

                if (pDevice->playback.intermediaryBufferLen == 0) {
                    /* There's nothing in the intermediary buffer. Fire the data callback to fill it. */
                    if (pDevice->type == ma_device_type_duplex) {
                        /* In duplex mode, the data callback will be fired later. Nothing to do here. */
                    } else {
                        ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, NULL, pDevice->playback.intermediaryBufferCap);

                        /* The intermediary buffer has just been filled. */
                        pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;
                    }
                }   
            }

            /* If we're in duplex mode we might need to do a refill of the data. */
            if (pDevice->type == ma_device_type_duplex) {
                if (pDevice->capture.intermediaryBufferLen == pDevice->capture.intermediaryBufferCap) {
                    ma_device__on_data_inner(pDevice, pDevice->playback.pIntermediaryBuffer, pDevice->capture.pIntermediaryBuffer, pDevice->capture.intermediaryBufferCap);

                    pDevice->playback.intermediaryBufferLen = pDevice->playback.intermediaryBufferCap;  /* The playback buffer will have just been filled. */
                    pDevice->capture.intermediaryBufferLen  = 0;                                        /* The intermediary buffer has just been drained. */
                }
            }

            /* Make sure this is only incremented once in the duplex case. */
            totalFramesProcessed += framesToProcessThisIteration;
        }
    }
}